

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

_Bool is_valid_tx_input(wally_tx_input *input)

{
  _Bool _Var1;
  _Bool local_12;
  _Bool local_11;
  wally_tx_input *input_local;
  
  local_11 = false;
  if ((input != (wally_tx_input *)0x0) &&
     (local_11 = false, (input->script != (uchar *)0x0) == (input->script_len != 0))) {
    if ((input->witness != (wally_tx_witness_stack *)0x0) &&
       (_Var1 = is_valid_witness_stack(input->witness), !_Var1)) {
      return false;
    }
    local_12 = true;
    if (input->pegin_witness != (wally_tx_witness_stack *)0x0) {
      local_12 = is_valid_witness_stack(input->pegin_witness);
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

static bool is_valid_tx_input(const struct wally_tx_input *input)
{
    return input &&
           BYTES_VALID(input->script, input->script_len) &&
           (!input->witness || is_valid_witness_stack(input->witness))
#ifdef BUILD_ELEMENTS
           && (!input->pegin_witness || is_valid_witness_stack(input->pegin_witness))
#endif
    ;
}